

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pluginmanager.cc
# Opt level: O2

void __thiscall Typelib::PluginManager::registerPluginTypes(PluginManager *this,Registry *registry)

{
  pointer ppTVar1;
  
  for (ppTVar1 = (this->m_definition_plugins).
                 super__Vector_base<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar1 !=
      (this->m_definition_plugins).
      super__Vector_base<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppTVar1 = ppTVar1 + 1) {
    (**(code **)(*(long *)*ppTVar1 + 0x10))(*ppTVar1,registry);
  }
  return;
}

Assistant:

void PluginManager::registerPluginTypes(Registry& registry)
{
    for (vector<TypeDefinitionPlugin*>::iterator it = m_definition_plugins.begin();
            it != m_definition_plugins.end(); ++it)
    {
        (*it)->registerTypes(registry);
    }
}